

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

int jumponcond(FuncState *fs,expdesc *e,int cond)

{
  uint uVar1;
  int iVar2;
  
  if ((e->k == VRELOCABLE) && (uVar1 = fs->f->code[(e->u).info], (uVar1 & 0x3f) == 0x1b)) {
    fs->pc = fs->pc + -1;
    luaK_code(fs,(uint)(cond == 0) << 0xe | uVar1 >> 0x11 & 0xffffffc0 | 0x22);
    iVar2 = luaK_jump(fs);
    return iVar2;
  }
  discharge2anyreg(fs,e);
  if (((e->k == VNONRELOC) && (((uint)(e->u).info >> 8 & 1) == 0)) &&
     ((int)(uint)fs->nactvar <= (e->u).info)) {
    fs->freereg = fs->freereg + 0xff;
  }
  luaK_code(fs,cond << 0xe | (e->u).info << 0x17 | 0x3fe3);
  iVar2 = luaK_jump(fs);
  return iVar2;
}

Assistant:

static int jumponcond (FuncState *fs, expdesc *e, int cond) {
  if (e->k == VRELOCABLE) {
    Instruction ie = getinstruction(fs, e);
    if (GET_OPCODE(ie) == OP_NOT) {
      fs->pc--;  /* remove previous OP_NOT */
      return condjump(fs, OP_TEST, GETARG_B(ie), 0, !cond);
    }
    /* else go through */
  }
  discharge2anyreg(fs, e);
  freeexp(fs, e);
  return condjump(fs, OP_TESTSET, NO_REG, e->u.info, cond);
}